

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_error.c
# Opt level: O1

void zip_error_get(zip_t *za,int *zep,int *sep)

{
  _zip_error_get(&za->error,zep,sep);
  return;
}

Assistant:

void
_zip_error_get(const zip_error_t *err, int *zep, int *sep) {
    if (zep)
	*zep = err->zip_err;
    if (sep) {
	if (zip_error_system_type(err) != ZIP_ET_NONE)
	    *sep = err->sys_err;
	else
	    *sep = 0;
    }
}